

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q4_K_impl(float *x,block_q4_K *y,int64_t n_per_row,float *quant_weights)

{
  ggml_fp16_t gVar1;
  uint uVar2;
  long lVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar4;
  float fVar5;
  int l_5;
  int j_3;
  uint8_t *q;
  int l_4;
  int ii;
  float dm;
  float d;
  int j_2;
  uint8_t m;
  uint8_t sc;
  uint8_t lm;
  uint8_t ls;
  int j_1;
  float m_block;
  float d_block;
  int l_3;
  float sumw;
  int l_2;
  int l_1;
  float *qw;
  int j;
  float av_x;
  float sigma2;
  int l;
  float sum_x2;
  int i;
  float scales [8];
  float mins [8];
  float sw [8];
  float weights [32];
  uint8_t Lm [8];
  uint8_t Ls [8];
  uint8_t Laux [32];
  uint8_t L [256];
  int64_t nb;
  int local_2b0;
  byte local_2ac;
  int local_2a8;
  int local_2a0;
  float in_stack_fffffffffffffd64;
  long local_298;
  int local_288;
  int local_27c;
  byte local_278;
  byte local_277;
  byte local_276;
  byte local_275;
  int local_274;
  float local_270;
  float local_26c;
  int local_268;
  float local_264;
  int local_260;
  int local_25c;
  long local_258;
  int local_250;
  float local_24c;
  float local_248;
  int local_244;
  float fVar6;
  int iVar7;
  uint8_t *in_stack_fffffffffffffdc8;
  float *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffddc;
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  float *in_stack_fffffffffffffde8;
  uint8_t *in_stack_fffffffffffffdf0;
  float *in_stack_fffffffffffffdf8;
  float *in_stack_fffffffffffffe00;
  float local_1f8;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  uint8_t *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  byte local_158 [8];
  byte local_150 [40];
  byte local_128 [256];
  long local_28;
  long local_20;
  long local_10;
  long local_8;
  
  local_28 = in_RDX / 0x100;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (iVar7 = 0; iVar7 < local_28; iVar7 = iVar7 + 1) {
    fVar6 = 0.0;
    for (local_244 = 0; local_244 < 0x100; local_244 = local_244 + 1) {
      fVar6 = *(float *)(local_8 + (long)local_244 * 4) * *(float *)(local_8 + (long)local_244 * 4)
              + fVar6;
    }
    local_248 = (fVar6 * 2.0) / 256.0;
    local_24c = sqrtf(local_248);
    for (local_250 = 0; local_250 < 8; local_250 = local_250 + 1) {
      if (local_20 == 0) {
        for (local_260 = 0; local_260 < 0x20; local_260 = local_260 + 1) {
          *(float *)(&stack0xfffffffffffffe28 + (long)local_260 * 4) =
               local_24c + ABS(*(float *)(local_8 + (long)(local_250 * 0x20 + local_260) * 4));
        }
      }
      else {
        local_258 = local_20 + (long)(iVar7 << 8) * 4 + (long)(local_250 << 5) * 4;
        for (local_25c = 0; local_25c < 0x20; local_25c = local_25c + 1) {
          fVar5 = *(float *)(local_258 + (long)local_25c * 4);
          fVar4 = sqrtf(*(float *)(local_8 + (long)(local_250 * 0x20 + local_25c) * 4) *
                        *(float *)(local_8 + (long)(local_250 * 0x20 + local_25c) * 4) + local_248);
          *(float *)(&stack0xfffffffffffffe28 + (long)local_25c * 4) = fVar5 * fVar4;
        }
      }
      local_264 = 0.0;
      for (local_268 = 0; local_268 < 0x20; local_268 = local_268 + 1) {
        local_264 = *(float *)(&stack0xfffffffffffffe28 + (long)local_268 * 4) + local_264;
      }
      (&local_1f8)[local_250] = local_264;
      fVar5 = make_qkx3_quants(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                               in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                               in_stack_fffffffffffffe20,in_stack_fffffffffffffde4,
                               in_stack_fffffffffffffde0,in_stack_fffffffffffffe28,
                               SUB41((uint)in_stack_fffffffffffffddc >> 0x18,0));
      *(float *)(&stack0xfffffffffffffdc8 + (long)local_250 * 4) = fVar5;
    }
    local_26c = make_qp_quants((int)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               (float *)CONCAT44(iVar7,fVar6));
    local_270 = make_qp_quants((int)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               (float *)CONCAT44(iVar7,fVar6));
    for (local_274 = 0; local_274 < 8; local_274 = local_274 + 1) {
      local_275 = local_150[local_274];
      local_276 = local_158[local_274];
      if (local_274 < 4) {
        *(byte *)(local_10 + (long)iVar7 * 0x90 + 4 + (long)local_274) = local_275;
        *(byte *)(local_10 + (long)iVar7 * 0x90 + 4 + (long)(local_274 + 4)) = local_276;
      }
      else {
        *(byte *)(local_10 + (long)iVar7 * 0x90 + 4 + (long)(local_274 + 4)) =
             local_275 & 0xf | local_276 << 4;
        lVar3 = local_10 + (long)iVar7 * 0x90;
        *(byte *)(lVar3 + 4 + (long)(local_274 + -4)) =
             *(byte *)(lVar3 + 4 + (long)(local_274 + -4)) |
             (byte)(((int)(uint)local_275 >> 4) << 6);
        lVar3 = local_10 + (long)iVar7 * 0x90;
        *(byte *)(lVar3 + 4 + (long)local_274) =
             *(byte *)(lVar3 + 4 + (long)local_274) | (byte)(((int)(uint)local_276 >> 4) << 6);
      }
    }
    gVar1 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffd64);
    *(ggml_fp16_t *)(local_10 + (long)iVar7 * 0x90) = gVar1;
    gVar1 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffd64);
    *(ggml_fp16_t *)(local_10 + (long)iVar7 * 0x90 + 2) = gVar1;
    for (local_27c = 0; local_27c < 8; local_27c = local_27c + 1) {
      get_scale_min_k4(local_27c,(uint8_t *)(local_10 + (long)iVar7 * 0x90 + 4),&local_277,
                       &local_278);
      fVar6 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)iVar7 * 0x90));
      fVar6 = fVar6 * (float)local_277;
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        fVar5 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)iVar7 * 0x90 + 2));
        uVar2 = (uint)local_278;
        for (local_288 = 0; local_288 < 0x20; local_288 = local_288 + 1) {
          local_2b0 = nearest_int((*(float *)(local_8 + (long)(local_27c * 0x20 + local_288) * 4) +
                                  fVar5 * (float)uVar2) / fVar6);
          local_2a8 = local_2b0;
          if (0xf < local_2b0) {
            local_2a8 = 0xf;
          }
          if (local_2a8 < 0) {
            local_2ac = 0;
          }
          else {
            if (0xf < local_2b0) {
              local_2b0 = 0xf;
            }
            local_2ac = (byte)local_2b0;
          }
          local_128[local_27c * 0x20 + local_288] = local_2ac;
        }
      }
    }
    local_298 = local_10 + (long)iVar7 * 0x90 + 0x10;
    for (in_stack_fffffffffffffd64 = 0.0; (int)in_stack_fffffffffffffd64 < 0x100;
        in_stack_fffffffffffffd64 = (float)((int)in_stack_fffffffffffffd64 + 0x40)) {
      for (local_2a0 = 0; local_2a0 < 0x20; local_2a0 = local_2a0 + 1) {
        *(byte *)(local_298 + local_2a0) =
             local_128[(int)in_stack_fffffffffffffd64 + local_2a0] |
             local_128[(int)in_stack_fffffffffffffd64 + local_2a0 + 0x20] << 4;
      }
      local_298 = local_298 + 0x20;
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

static void quantize_row_q4_K_impl(const float * GGML_RESTRICT x, block_q4_K * GGML_RESTRICT y, int64_t n_per_row, const float * quant_weights) {
    assert(n_per_row % QK_K == 0);
    const int64_t nb = n_per_row / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[32];
    uint8_t Ls[QK_K/32];
    uint8_t Lm[QK_K/32];
    float   weights[32];
    float   sw[QK_K/32];
    float   mins[QK_K/32];
    float   scales[QK_K/32];

    for (int i = 0; i < nb; i++) {

        float sum_x2 = 0;
        for (int l = 0; l < QK_K; ++l) sum_x2 += x[l] * x[l];
        float sigma2 = 2*sum_x2/QK_K;
        float av_x = sqrtf(sigma2);

        for (int j = 0; j < QK_K/32; ++j) {
            if (quant_weights) {
                const float * qw = quant_weights + QK_K*i + 32*j;
                for (int l = 0; l < 32; ++l) weights[l] = qw[l] * sqrtf(sigma2 + x[32*j + l]*x[32*j + l]);
            } else {
                for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            }
            float sumw = 0;
            for (int l = 0; l < 32; ++l) sumw += weights[l];
            sw[j] = sumw;
            scales[j] = make_qkx3_quants(32, 15, x + 32*j, weights, L + 32*j, &mins[j], Laux, -0.9f, 0.05f, 36, false);
        }

        float d_block = make_qp_quants(QK_K/32, 63, scales, Ls, sw);
        float m_block = make_qp_quants(QK_K/32, 63, mins,   Lm, sw);
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = Ls[j];
            uint8_t lm = Lm[j];
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(d_block);
        y[i].dmin = GGML_FP32_TO_FP16(m_block);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(15, l));
                L[32*j + ii] = l;
            }
        }
        uint8_t * q = y[i].qs;
        for (int j = 0; j < QK_K; j += 64) {
            for (int l = 0; l < 32; ++l) q[l] = L[j + l] | (L[j + l + 32] << 4);
            q += 32;
        }

        x += QK_K;

    }
}